

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBitString.h
# Opt level: O0

void __thiscall jbcoin::STBitString<256UL>::add(STBitString<256UL> *this,Serializer *s)

{
  SerializedTypeID SVar1;
  bool bVar2;
  SerializedTypeID SVar3;
  Serializer *s_local;
  STBitString<256UL> *this_local;
  
  bVar2 = SField::isBinary((this->super_STBase).fName);
  if (!bVar2) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STBitString.h"
                  ,0x60,"virtual void jbcoin::STBitString<256>::add(Serializer &) const");
  }
  SVar1 = ((this->super_STBase).fName)->fieldType;
  SVar3 = getSType(this);
  if (SVar1 == SVar3) {
    Serializer::addBitString<256,void>(s,&this->value_);
    return;
  }
  __assert_fail("fName->fieldType == getSType()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STBitString.h"
                ,0x61,"virtual void jbcoin::STBitString<256>::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == getSType());
        s.addBitString<Bits> (value_);
    }